

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pine.hh
# Opt level: O0

void __thiscall OB::Regex::~Regex(Regex *this)

{
  Regex *this_local;
  
  std::__cxx11::string::~string((string *)&this->str_);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&this->super_regex);
  return;
}

Assistant:

Regex(const char* cstr) : std::regex {cstr}, str_ {cstr} {}